

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.cpp
# Opt level: O0

void __thiscall
qclab::qgates::QGate1<float>::apply
          (QGate1<float> *this,Op op,int nbQubits,vector<float,_std::allocator<float>_> *vector,
          int offset)

{
  int iVar1;
  float *vector_00;
  SquareMatrix<float> local_50;
  undefined1 local_40 [8];
  anon_class_24_5_e9a28bf2 f;
  int qubit;
  int offset_local;
  vector<float,_std::allocator<float>_> *vector_local;
  int nbQubits_local;
  Op op_local;
  QGate1<float> *this_local;
  
  f.m22 = (float)offset;
  iVar1 = (*(this->super_QObject<float>)._vptr_QObject[3])();
  f.m21 = (float)(iVar1 + (int)f.m22);
  (*(this->super_QObject<float>)._vptr_QObject[7])();
  vector_00 = std::vector<float,_std::allocator<float>_>::data(vector);
  lambda_QGate1<float>((anon_class_24_5_e9a28bf2 *)local_40,op,&local_50,vector_00);
  dense::SquareMatrix<float>::~SquareMatrix(&local_50);
  apply2<qclab::qgates::lambda_QGate1<float>(qclab::Op,qclab::dense::SquareMatrix<float>,float*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,(int)f.m21,(anon_class_24_5_e9a28bf2 *)local_40);
  return;
}

Assistant:

void QGate1< T >::apply( Op op , const int nbQubits ,
                           std::vector< T >& vector , const int offset ) const {
    const int qubit = this->qubit() + offset ;
    auto f = lambda_QGate1( op , this->matrix() , vector.data() ) ;
    apply2( nbQubits , qubit , f ) ;
  }